

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O3

void init_scaling_function(int (*scaling_points) [2],int num_points,int *scaling_lut)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  if (num_points != 0) {
    if (0 < (*scaling_points)[0]) {
      iVar1 = (*scaling_points)[1];
      lVar3 = 0;
      do {
        scaling_lut[lVar3] = iVar1;
        lVar3 = lVar3 + 1;
      } while (lVar3 < (*scaling_points)[0]);
    }
    uVar5 = num_points - 1;
    if (1 < num_points) {
      uVar6 = 0;
      do {
        uVar7 = scaling_points[uVar6 + 1][0] - scaling_points[uVar6][0];
        if (0 < (int)uVar7) {
          iVar1 = scaling_points[uVar6 + 1][1];
          iVar2 = scaling_points[uVar6][1];
          lVar3 = 0x8000;
          uVar8 = 0;
          do {
            scaling_lut[scaling_points[uVar6][0] + (int)uVar8] =
                 (int)((ulong)lVar3 >> 0x10) + scaling_points[uVar6][1];
            uVar8 = uVar8 + 1;
            lVar3 = lVar3 + ((((int)uVar7 >> 1) + 0x10000) / (int)uVar7) * (iVar1 - iVar2);
          } while (uVar7 != uVar8);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar5);
    }
    if ((long)scaling_points[(int)uVar5][0] < 0x100) {
      iVar1 = scaling_points[(int)uVar5][1];
      lVar3 = (long)scaling_points[(int)uVar5][0];
      do {
        lVar4 = lVar3 + 1;
        scaling_lut[lVar3] = iVar1;
        lVar3 = lVar4;
      } while ((int)lVar4 != 0x100);
    }
  }
  return;
}

Assistant:

static void init_scaling_function(const int scaling_points[][2], int num_points,
                                  int scaling_lut[]) {
  if (num_points == 0) return;

  for (int i = 0; i < scaling_points[0][0]; i++)
    scaling_lut[i] = scaling_points[0][1];

  for (int point = 0; point < num_points - 1; point++) {
    int delta_y = scaling_points[point + 1][1] - scaling_points[point][1];
    int delta_x = scaling_points[point + 1][0] - scaling_points[point][0];

    int64_t delta = delta_y * ((65536 + (delta_x >> 1)) / delta_x);

    for (int x = 0; x < delta_x; x++) {
      scaling_lut[scaling_points[point][0] + x] =
          scaling_points[point][1] + (int)((x * delta + 32768) >> 16);
    }
  }

  for (int i = scaling_points[num_points - 1][0]; i < 256; i++)
    scaling_lut[i] = scaling_points[num_points - 1][1];
}